

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::FileDescriptorTables::FileDescriptorTables(FileDescriptorTables *this)

{
  (this->symbols_by_parent_).
  super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       1;
  (this->symbols_by_parent_).
  super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  this->fields_by_lowercase_name_once_ = (atomic<unsigned_int>)0x0;
  this->fields_by_camelcase_name_once_ = (atomic<unsigned_int>)0x0;
  (this->fields_by_lowercase_name_)._M_b._M_p = (__pointer_type)0x0;
  (this->fields_by_camelcase_name_)._M_b._M_p = (__pointer_type)0x0;
  (this->fields_by_number_).
  super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       1;
  (this->fields_by_number_).
  super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  (this->enum_values_by_number_).
  super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       1;
  (this->enum_values_by_number_).
  super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  (this->unknown_enum_values_by_number_).
  super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       1;
  (this->unknown_enum_values_by_number_).
  super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  (this->locations_by_path_once_).control_.super___atomic_base<unsigned_int>._M_i = 0;
  (this->locations_by_path_).
  super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>_>
  .
  super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  *(size_t *)
   ((long)&(this->locations_by_path_).
           super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>_>
           .
           super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>_>
           .settings_.
           super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value +
   8) = 0;
  (((HeapOrSoo *)
   ((long)&(this->locations_by_path_).
           super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>_>
           .
           super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>_>
           .settings_.
           super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value +
   0x10))->heap).control =
       (ctrl_t *)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>;
  (this->unknown_enum_values_mu_).mu_.super___atomic_base<long>._M_i = 0;
  return;
}

Assistant:

FileDescriptorTables::FileDescriptorTables() = default;